

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocking_queue_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::
BlockingQueueTest_test_poll_will_block_until_second_thread_pushes_to_empty_queue_Test::TestBody
          (BlockingQueueTest_test_poll_will_block_until_second_thread_pushes_to_empty_queue_Test
           *this)

{
  long lVar1;
  long lVar2;
  char *message;
  char *in_R9;
  duration<long,_std::ratio<1L,_1000L>_> local_100;
  AssertHelper local_f8;
  thread thread;
  AssertionResult gtest_ar;
  duration elapsed;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  BlockingQueue<int> queue;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  memset(&queue,0,0xa8);
  BlockingQueue<int>::BlockingQueue(&queue);
  local_100.__r._0_4_ = 1;
  elapsed.__r = 500;
  gtest_ar._0_8_ = &queue;
  std::thread::
  thread<void(&)(bidfx_public_api::tools::BlockingQueue<int>*,int,std::chrono::duration<long,std::ratio<1l,1000l>>),bidfx_public_api::tools::BlockingQueue<int>*,int,std::chrono::duration<long,std::ratio<1l,1000l>>,void>
            (&thread,PushToIntBlockingQueueAfterSleep,(BlockingQueue<int> **)&gtest_ar,
             (int *)&local_100,(duration<long,_std::ratio<1L,_1000L>_> *)&elapsed);
  BlockingQueue<int>::Poll((iterator *)&gtest_ar,&queue,(milliseconds)0x3e8);
  local_c0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  elapsed.__r._0_1_ = *(int *)gtest_ar._0_8_ == 1;
  if (*(int *)gtest_ar._0_8_ != 1) {
    testing::Message::Message((Message *)&local_100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&elapsed,
               (AssertionResult *)"*queue.Poll(std::chrono::milliseconds(1000)) == 1","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/blocking_queue_test.cpp"
               ,0x58,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_100);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_c0);
  lVar2 = std::chrono::_V2::system_clock::now();
  elapsed.__r = lVar2 - lVar1;
  local_100.__r = 600;
  testing::internal::
  CmpHelperLT<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000l>>>
            ((internal *)&gtest_ar,"elapsed","std::chrono::milliseconds(600)",&elapsed,&local_100);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_100);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/blocking_queue_test.cpp"
               ,0x5c,message);
    testing::internal::AssertHelper::operator=(&local_f8,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_100);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::thread::join();
  std::thread::~thread(&thread);
  BlockingQueue<int>::~BlockingQueue(&queue);
  return;
}

Assistant:

TEST(BlockingQueueTest, test_poll_will_block_until_second_thread_pushes_to_empty_queue)
{
    std::chrono::high_resolution_clock::time_point start_time = std::chrono::high_resolution_clock::now();
    BlockingQueue<int> queue = BlockingQueue<int>();

    std::thread thread(PushToIntBlockingQueueAfterSleep, &queue, 1, std::chrono::milliseconds(500));
    EXPECT_TRUE(*queue.Poll(std::chrono::milliseconds(1000)) == 1);

    std::chrono::high_resolution_clock::time_point time_now = std::chrono::high_resolution_clock::now();
    std::chrono::high_resolution_clock::duration elapsed = time_now - start_time;
    EXPECT_LT(elapsed, std::chrono::milliseconds(600));

    thread.join();
}